

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallBuffer.hpp
# Opt level: O2

bool isEscapableData(SmallBuffer *data)

{
  byte *pbVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *pbVar4;
  size_t sVar5;
  long lVar6;
  
  sVar5 = data->bufferSize;
  pbVar1 = data->heap + sVar5;
  pbVar2 = data->heap + 1;
  for (lVar6 = (long)sVar5 >> 2; 0 < lVar6; lVar6 = lVar6 + -1) {
    if ((byte)(pbVar2[-1] + 0x81) < 0xa1 && (byte)(pbVar2[-1] - 0xb) < 0xfe) {
      pbVar2 = pbVar2 + -1;
      goto LAB_001917da;
    }
    if ((byte)(*pbVar2 + 0x81) < 0xa1 && (byte)(*pbVar2 - 0xb) < 0xfe) goto LAB_001917da;
    if ((byte)(pbVar2[1] + 0x81) < 0xa1 && (byte)(pbVar2[1] - 0xb) < 0xfe) {
      pbVar2 = pbVar2 + 1;
      goto LAB_001917da;
    }
    if ((byte)(pbVar2[2] + 0x81) < 0xa1 && (byte)(pbVar2[2] - 0xb) < 0xfe) {
      pbVar2 = pbVar2 + 2;
      goto LAB_001917da;
    }
    pbVar2 = pbVar2 + 4;
    sVar5 = sVar5 - 4;
  }
  pbVar4 = pbVar2 + -1;
  if (sVar5 != 1) {
    if (sVar5 == 3) {
      pbVar3 = pbVar2;
      pbVar2 = pbVar4;
      if ((byte)(*pbVar4 + 0x81) < 0xa1 && (byte)(*pbVar4 - 0xb) < 0xfe) goto LAB_001917da;
    }
    else {
      pbVar3 = pbVar4;
      pbVar2 = pbVar1;
      if (sVar5 != 2) goto LAB_001917da;
    }
    pbVar2 = pbVar3;
    if ((byte)(*pbVar3 + 0x81) < 0xa1 && (byte)(*pbVar3 - 0xb) < 0xfe) goto LAB_001917da;
    pbVar4 = pbVar3 + 1;
  }
  pbVar2 = pbVar4;
  if (0xa0 < (byte)(*pbVar4 + 0x81) || 0xfd < (byte)(*pbVar4 - 0xb)) {
    pbVar2 = pbVar1;
  }
LAB_001917da:
  return pbVar2 == pbVar1;
}

Assistant:

std::string_view to_string() const
    {
        return std::string_view{reinterpret_cast<const char*>(heap), bufferSize};
    }